

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

void __thiscall
Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)10,_false>::
ControlPacket(ControlPacket<(Protocol::MQTT::Common::ControlPacketType)10,_false> *this)

{
  (this->super_ControlPacketSerializableImpl).header = &(this->header).super_FixedHeaderBase;
  (this->super_ControlPacketSerializableImpl).remLength.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_00126958;
  (this->super_ControlPacketSerializableImpl).remLength.size = 1;
  (this->super_ControlPacketSerializableImpl).remLength.field_0.value[0] = '\0';
  (this->super_ControlPacketSerializableImpl).fixedVariableHeader =
       (FixedFieldGeneric *)&this->fixedVariableHeader;
  (this->super_ControlPacketSerializableImpl).props = &(this->props).super_SerializableProperties;
  (this->super_ControlPacketSerializableImpl).payload = &(this->payload).super_SerializablePayload;
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_00128728;
  (this->header).super_FixedHeaderBase.typeAndFlags = 0xa2;
  (this->header).super_FixedHeaderBase._vptr_FixedHeaderBase = (_func_int **)&PTR_getType_00128780;
  (this->fixedVariableHeader).super_FixedFieldWithID.super_FixedFieldGeneric.value =
       &(this->fixedVariableHeader).super_FixedFieldWithID.packetID.super_GenericTypeBase;
  (this->fixedVariableHeader).super_FixedFieldWithID.packetID.super_GenericTypeBase.
  _vptr_GenericTypeBase = (_func_int **)&PTR_typeSize_001273d8;
  (this->fixedVariableHeader).super_FixedFieldWithID.packetID.value = 0;
  (this->fixedVariableHeader).super_FixedFieldWithID.super_FixedFieldGeneric.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_001287c8;
  (this->props).super_SerializableProperties.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_00127948;
  (this->props).length.super_Serializable._vptr_Serializable = (_func_int **)&PTR_getSize_00126958;
  (this->props).length.size = 1;
  (this->props).length.field_0.value[0] = '\0';
  (this->props).head = (PropertyBase *)0x0;
  (this->props).reference = (PropertyBase *)0x0;
  (this->payload).super_SerializablePayload.super_EmptySerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_00128828;
  (this->payload).topics = (UnsubscribeTopic *)0x0;
  (this->payload).expSize = 0;
  return;
}

Assistant:

ControlPacket() : ControlPacketSerializableImpl(header, fixedVariableHeader, props, payload)
                {
                    payload.setFlags(fixedVariableHeader); fixedVariableHeader.setFlags(header.typeAndFlags);
                }